

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O3

BOOL pattern_range(char *pattern,int which,PatternRange *range)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *p;
  char *pcVar6;
  int iVar7;
  char cVar8;
  
  iVar5 = (int)pattern;
  do {
    if (*pattern == '\0') {
      return FALSE;
    }
    pcVar6 = pattern + -1;
    pattern = pcVar6;
    do {
      pbVar1 = (byte *)(pattern + 1);
      pattern = pattern + 1;
      pcVar6 = pcVar6 + 1;
    } while ((*pbVar1 & 0xfe) == 0x30);
    iVar4 = (int)pcVar6;
    range->index = iVar4 - iVar5;
    cVar2 = *pattern;
    cVar8 = cVar2;
    iVar7 = iVar4;
    if (cVar2 != '\0') {
      do {
        if (cVar8 != cVar2) break;
        pcVar6 = pattern + 1;
        pattern = pattern + 1;
        cVar8 = *pcVar6;
      } while (*pcVar6 != '\0');
      iVar7 = (int)pattern;
    }
    range->length = iVar7 - iVar4;
    bVar3 = which < 2;
    which = which + -1;
    if (bVar3) {
      return TRUE;
    }
  } while( true );
}

Assistant:

BOOL
pattern_range (const char *pattern, int which, PatternRange *range)
{
  const char *p = pattern, *p2;

  do
    {
      if (*p == '\0')
	return FALSE;

      /* Skip to first sequence. */
      for (; *p != '\0' && (*p == '0' || *p == '1'); p++)
	;

      /* Remember where the pattern started. */
      range->index = p - pattern;
      p2 = p;

      /* Find the end of the sequence. */
      for (; *p != '\0' && *p == *p2; p++)
	;

      /* Remember the length of the pattern. */
      range->length = p - p2;
    }
  while (--which > 0);

  return TRUE;
}